

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O1

void __thiscall TypeChar::saveXml(TypeChar *this,ostream *s)

{
  ostream *poVar1;
  char local_31;
  char *local_30;
  long local_28;
  char local_20 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"<type",5);
  Datatype::saveXmlBasic((Datatype *)this,s);
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"char","");
  local_31 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(s,&local_31,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  std::__ostream_insert<char,std::char_traits<char>>(s,"true",4);
  std::__ostream_insert<char,std::char_traits<char>>(s,"\"",1);
  if (local_30 != local_20) {
    operator_delete(local_30);
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"/>",2);
  return;
}

Assistant:

void TypeChar::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  a_v_b(s,"char",true);
  s << "/>";
}